

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_update_stream_priority(nghttp2_session *session,nghttp2_stream *stream,uint8_t u8extpri)

{
  uint8_t u8extpri_local;
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  if (stream->extpri == u8extpri) {
    session_local._4_4_ = 0;
  }
  else if (stream->queued == '\0') {
    stream->extpri = u8extpri;
    session_local._4_4_ = 0;
  }
  else {
    session_ob_data_remove(session,stream);
    stream->extpri = u8extpri;
    session_local._4_4_ = session_ob_data_push(session,stream);
  }
  return session_local._4_4_;
}

Assistant:

static int session_update_stream_priority(nghttp2_session *session,
                                          nghttp2_stream *stream,
                                          uint8_t u8extpri) {
  if (stream->extpri == u8extpri) {
    return 0;
  }

  if (stream->queued) {
    session_ob_data_remove(session, stream);

    stream->extpri = u8extpri;

    return session_ob_data_push(session, stream);
  }

  stream->extpri = u8extpri;

  return 0;
}